

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

size_t CountWitnessSigOps(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,
                         uint flags)

{
  bool bVar1;
  int iVar2;
  CScript *pCVar3;
  uint uVar4;
  CScriptWitness *pCVar5;
  uint uVar6;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  CScript subscript;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  const_iterator local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_5c;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)::
      witnessEmpty == '\0') {
    iVar2 = __cxa_guard_acquire(&CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)
                                 ::witnessEmpty);
    if (iVar2 != 0) {
      CountWitnessSigOps::witnessEmpty.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      CountWitnessSigOps::witnessEmpty.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      CountWitnessSigOps::witnessEmpty.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(CScriptWitness::~CScriptWitness,&CountWitnessSigOps::witnessEmpty,&__dso_handle);
      __cxa_guard_release(&CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)
                           ::witnessEmpty);
    }
  }
  if ((flags >> 0xb & 1) == 0) {
    scriptSig = (CScript *)0x0;
    goto LAB_00390a36;
  }
  if ((flags & 1) == 0) {
    __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x836,
                  "size_t CountWitnessSigOps(const CScript &, const CScript &, const CScriptWitness *, unsigned int)"
                 );
  }
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = CScript::IsWitnessProgram
                    (scriptPubKey,&local_5c,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
  if (bVar1) {
    pCVar5 = &CountWitnessSigOps::witnessEmpty;
    if (witness != (CScriptWitness *)0x0) {
      pCVar5 = witness;
    }
    scriptSig = (CScript *)
                WitnessSigOps(local_5c,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &local_78,pCVar5);
  }
  else {
    bVar1 = CScript::IsPayToScriptHash(scriptPubKey);
    if (bVar1) {
      bVar1 = CScript::IsPushOnly(scriptSig);
      if (bVar1) {
        uVar4 = (scriptSig->super_CScriptBase)._size;
        pCVar3 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
        local_80.ptr = (uchar *)pCVar3;
        if (uVar4 < 0x1d) {
          local_80.ptr = (uchar *)scriptSig;
        }
        local_98._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
        local_98._M_impl.super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          uVar6 = uVar4 - 0x1d;
          if (uVar4 < 0x1d) {
            uVar6 = uVar4;
          }
          if (uVar4 < 0x1d) {
            pCVar3 = scriptSig;
          }
          if ((CScript *)((pCVar3->super_CScriptBase)._union.direct + (int)uVar6) <= local_80.ptr)
          break;
          CScript::GetOp(scriptSig,&local_80,(opcodetype *)&local_58,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
          uVar4 = (scriptSig->super_CScriptBase)._size;
          pCVar3 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (&local_58,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_98._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_98._M_impl.super__Vector_impl_data._M_finish);
        bVar1 = CScript::IsWitnessProgram
                          ((CScript *)&local_58,&local_5c,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
        if (bVar1) {
          pCVar5 = &CountWitnessSigOps::witnessEmpty;
          if (witness != (CScriptWitness *)0x0) {
            pCVar5 = witness;
          }
          scriptSig = (CScript *)
                      WitnessSigOps(local_5c,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&local_78,pCVar5);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
        if (bVar1) goto LAB_00390a2c;
      }
    }
    scriptSig = (CScript *)0x0;
  }
LAB_00390a2c:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
LAB_00390a36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (size_t)scriptSig;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountWitnessSigOps(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags)
{
    static const CScriptWitness witnessEmpty;

    if ((flags & SCRIPT_VERIFY_WITNESS) == 0) {
        return 0;
    }
    assert((flags & SCRIPT_VERIFY_P2SH) != 0);

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
    }

    if (scriptPubKey.IsPayToScriptHash() && scriptSig.IsPushOnly()) {
        CScript::const_iterator pc = scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < scriptSig.end()) {
            opcodetype opcode;
            scriptSig.GetOp(pc, opcode, data);
        }
        CScript subscript(data.begin(), data.end());
        if (subscript.IsWitnessProgram(witnessversion, witnessprogram)) {
            return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
        }
    }

    return 0;
}